

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O0

void * __thiscall
density_tests::DeepTestAllocator<65536UL>::allocate_page_zeroed(DeepTestAllocator<65536UL> *this)

{
  void *i_block;
  void *page;
  DeepTestAllocator<65536UL> *this_local;
  
  exception_checkpoint();
  i_block = density::basic_default_allocator<65536UL>::allocate_page_zeroed
                      ((basic_default_allocator<65536UL> *)this);
  SharedBlockRegistry::register_block(&this->m_registry,4,i_block,0xfff0,0x10000,0);
  DeepTestAllocator<65536ul>::invoke_hook<void*>((DeepTestAllocator<65536ul> *)this,1,(void *)0x0);
  return i_block;
}

Assistant:

void * allocate_page_zeroed()
        {
            exception_checkpoint();

            auto page = Base::allocate_page_zeroed();
            m_registry.register_block(s_page_category, page, page_size, page_alignment, 0);
            invoke_hook(&IAllocatorHook::on_allocated_page, page);
            return page;
        }